

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall
ColorPrimariesBT601_525_SMPTE::ColorPrimariesBT601_525_SMPTE(ColorPrimariesBT601_525_SMPTE *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_f2;
  allocator_type local_f1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ColorPrimaryTransform local_d4;
  _Vector_base<float,_std::allocator<float>_> local_b0;
  float local_98 [12];
  float local_68 [11];
  ColorPrimaryTransform local_3c;
  
  local_68[4] = 0.70106;
  local_68[5] = 0.086564;
  local_68[6] = 0.018739;
  local_68[7] = 0.111934;
  local_68[0] = 0.393521;
  local_68[1] = 0.365258;
  local_68[2] = 0.191677;
  local_68[3] = 0.212376;
  local_68[8] = 0.958385;
  __l._M_len = 9;
  __l._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,__l,&local_f1);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_d4,(vector<float,_std::allocator<float>_> *)&local_f0);
  local_98[4] = 1.977779;
  local_98[5] = 0.035171;
  local_98[6] = 0.056307;
  local_98[7] = -0.196976;
  local_98[0] = 3.506003;
  local_98[1] = -1.739791;
  local_98[2] = -0.544058;
  local_98[3] = -1.069048;
  local_98[8] = 1.049952;
  __l_00._M_len = 9;
  __l_00._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b0,__l_00,&local_f2);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_3c,(vector<float,_std::allocator<float>_> *)&local_b0);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_d4.matrix[2][2];
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_d4.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = local_d4.matrix[2]._0_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_d4.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = local_d4.matrix._8_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_3c.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = local_3c.matrix._8_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_3c.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = local_3c.matrix[2]._0_8_;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_3c.matrix[2][2];
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  return;
}

Assistant:

ColorPrimariesBT601_525_SMPTE() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.393521f, +0.365258f, +0.191677f,
            +0.212376f, +0.701060f, +0.086564f,
            +0.018739f, +0.111934f, +0.958385f
        }),
        ColorPrimaryTransform({
            +3.506003f, -1.739791f, -0.544058f,
            -1.069048f, +1.977779f, +0.035171f,
            +0.056307f, -0.196976f, +1.049952f
        })
    ) {}